

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

optional<spv::Capability>
spvtools::opt::Handler_OpImageRead_StorageImageReadWithoutFormat(Instruction *instruction)

{
  uint32_t uVar1;
  uint32_t uVar2;
  DefUseManager *this;
  Instruction *pIVar3;
  _Optional_payload_base<spv::Capability> _Var4;
  
  if (instruction->opcode_ == OpImageRead) {
    this = IRContext::get_def_use_mgr(instruction->context_);
    uVar1 = Instruction::GetSingleWordInOperand(instruction,0);
    pIVar3 = analysis::DefUseManager::GetDef(this,uVar1);
    uVar1 = Instruction::type_id(pIVar3);
    pIVar3 = analysis::DefUseManager::GetDef(this,uVar1);
    uVar1 = Instruction::GetSingleWordInOperand(pIVar3,1);
    uVar2 = Instruction::GetSingleWordInOperand(pIVar3,6);
    _Var4._M_payload = (_Storage<spv::Capability,_true>)0x37;
    _Var4._M_engaged = false;
    _Var4._5_3_ = 0;
    if (uVar1 != 6) {
      _Var4 = (_Optional_payload_base<spv::Capability>)((ulong)(uVar2 == 0) << 0x20 | 0x37);
    }
    return (optional<spv::Capability>)_Var4;
  }
  __assert_fail("instruction->opcode() == spv::Op::OpImageRead && \"This handler only support OpImageRead opcodes.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0x14c,
                "std::optional<spv::Capability> spvtools::opt::Handler_OpImageRead_StorageImageReadWithoutFormat(const Instruction *)"
               );
}

Assistant:

static std::optional<spv::Capability>
Handler_OpImageRead_StorageImageReadWithoutFormat(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpImageRead &&
         "This handler only support OpImageRead opcodes.");
  const auto* def_use_mgr = instruction->context()->get_def_use_mgr();

  const uint32_t image_index =
      instruction->GetSingleWordInOperand(kOpImageReadImageIndex);
  const uint32_t type_index = def_use_mgr->GetDef(image_index)->type_id();
  const Instruction* type = def_use_mgr->GetDef(type_index);
  const uint32_t dim = type->GetSingleWordInOperand(kOpTypeImageDimIndex);
  const uint32_t format = type->GetSingleWordInOperand(kOpTypeImageFormatIndex);

  // If the Image Format is Unknown and Dim is SubpassData,
  // StorageImageReadWithoutFormat is required.
  const bool is_unknown = spv::ImageFormat(format) == spv::ImageFormat::Unknown;
  const bool requires_capability_for_unknown =
      spv::Dim(dim) != spv::Dim::SubpassData;
  return is_unknown && requires_capability_for_unknown
             ? std::optional(spv::Capability::StorageImageReadWithoutFormat)
             : std::nullopt;
}